

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

void __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::updateIndexedViews
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  pointer ptVar1;
  ManagedBuffer<unsigned_int> *this_00;
  element_type *peVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  pointer ptVar3;
  shared_ptr<polyscope::render::AttributeBuffer> viewBufferPtr;
  vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  expandData;
  __shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
  local_48;
  
  checkDeviceBufferTypeIs(this,Attribute);
  removeDeletedIndexedViews(this);
  ptVar1 = (this->existingIndexedViews).
           super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar3 = (this->existingIndexedViews).
                super__Vector_base<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>,_std::allocator<std::tuple<polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar3 != ptVar1; ptVar3 = ptVar3 + 1) {
    std::__shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,ptVar3);
    peVar2 = local_58._M_ptr;
    if (local_58._M_ptr != (element_type *)0x0) {
      this_00 = (ptVar3->
                super__Tuple_impl<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_std::weak_ptr<polyscope::render::AttributeBuffer>_>
                ).super__Head_base<0UL,_polyscope::render::ManagedBuffer<unsigned_int>_*,_false>.
                _M_head_impl;
      ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(this_00);
      gather<glm::vec<3,unsigned_int,(glm::qualifier)0>>
                ((vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                  *)&local_48,(polyscope *)this->data,
                 (vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
                  *)this_00->data,in_RCX);
      (*peVar2->_vptr_AttributeBuffer[10])(peVar2,&local_48);
      std::
      _Vector_base<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
      ::~_Vector_base(&local_48);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  }
  requestRedraw();
  return;
}

Assistant:

void ManagedBuffer<T>::updateIndexedViews() {
  checkDeviceBufferTypeIs(DeviceBufferType::Attribute);

  removeDeletedIndexedViews(); // periodic filtering

  for (std::tuple<render::ManagedBuffer<uint32_t>*, std::weak_ptr<render::AttributeBuffer>>& existingViewTup :
       existingIndexedViews) {

    std::shared_ptr<render::AttributeBuffer> viewBufferPtr = std::get<1>(existingViewTup).lock();
    if (!viewBufferPtr) continue; // skip if it has been deleted (will be removed eventually)

    // note: index buffer must still be alive here. we can't check it, you will just get memory errors
    // if it has been deleted
    render::ManagedBuffer<uint32_t>& indices = *std::get<0>(existingViewTup);
    render::AttributeBuffer& viewBuffer = *viewBufferPtr;

    // apply the indexing and set the data
    indices.ensureHostBufferPopulated();
    std::vector<T> expandData = gather(data, indices.data);
    viewBuffer.setData(expandData);

    // TODO fornow, only CPU-side updating is supported. Add direct GPU-side support using the bufferIndexCopyProgram
    // below.
  }

  requestRedraw();
}